

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastMultiplier3(Gia_Man_t *pNew,int *pArgA,int *pArgB,int nArgA,int nArgB,Vec_Int_t *vRes)

{
  int Entry;
  Vec_Wec_t *vProds_00;
  Vec_Wec_t *vLevels_00;
  int local_48;
  int local_44;
  int k;
  int i;
  Vec_Wec_t *vLevels;
  Vec_Wec_t *vProds;
  Vec_Int_t *vRes_local;
  int nArgB_local;
  int nArgA_local;
  int *pArgB_local;
  int *pArgA_local;
  Gia_Man_t *pNew_local;
  
  vProds_00 = Vec_WecStart(nArgA + nArgB);
  vLevels_00 = Vec_WecStart(nArgA + nArgB);
  for (local_44 = 0; local_44 < nArgA; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < nArgB; local_48 = local_48 + 1) {
      Entry = Gia_ManHashAnd(pNew,pArgA[local_44],pArgB[local_48]);
      Vec_WecPush(vProds_00,local_44 + local_48,Entry);
      Vec_WecPush(vLevels_00,local_44 + local_48,0);
    }
  }
  Wlc_BlastReduceMatrix(pNew,vProds_00,vLevels_00,vRes);
  Vec_WecFree(vProds_00);
  Vec_WecFree(vLevels_00);
  return;
}

Assistant:

void Wlc_BlastMultiplier3( Gia_Man_t * pNew, int * pArgA, int * pArgB, int nArgA, int nArgB, Vec_Int_t * vRes )
{
    Vec_Wec_t * vProds  = Vec_WecStart( nArgA + nArgB );
    Vec_Wec_t * vLevels = Vec_WecStart( nArgA + nArgB );
    int i, k;
    for ( i = 0; i < nArgA; i++ )
        for ( k = 0; k < nArgB; k++ )
        {
            Vec_WecPush( vProds,  i+k, Gia_ManHashAnd(pNew, pArgA[i], pArgB[k]) );
            Vec_WecPush( vLevels, i+k, 0 );
        }

    Wlc_BlastReduceMatrix( pNew, vProds, vLevels, vRes );

    Vec_WecFree( vProds );
    Vec_WecFree( vLevels );
}